

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O1

void __thiscall
t_netstd_generator::cleanup_member_name_mapping(t_netstd_generator *this,void *scope)

{
  pointer pmVar1;
  undefined8 *puVar2;
  char *pcVar3;
  
  pmVar1 = (this->member_mapping_scopes).
           super__Vector_base<t_netstd_generator::member_mapping_scope,_std::allocator<t_netstd_generator::member_mapping_scope>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->member_mapping_scopes).
      super__Vector_base<t_netstd_generator::member_mapping_scope,_std::allocator<t_netstd_generator::member_mapping_scope>_>
      ._M_impl.super__Vector_impl_data._M_start == pmVar1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = "internal error: cleanup_member_name_mapping() no scope active";
  }
  else {
    if (pmVar1[-1].scope_member == scope) {
      (this->member_mapping_scopes).
      super__Vector_base<t_netstd_generator::member_mapping_scope,_std::allocator<t_netstd_generator::member_mapping_scope>_>
      ._M_impl.super__Vector_impl_data._M_finish = pmVar1 + -1;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&pmVar1[-1].mapping_table._M_t);
      return;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    pcVar3 = "internal error: cleanup_member_name_mapping() called for wrong struct";
  }
  *puVar2 = pcVar3;
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

void t_netstd_generator::cleanup_member_name_mapping(void* scope)
{
    if (member_mapping_scopes.empty())
    {
        throw "internal error: cleanup_member_name_mapping() no scope active";
    }

    member_mapping_scope& active = member_mapping_scopes.back();
    if (active.scope_member != scope)
    {
        throw "internal error: cleanup_member_name_mapping() called for wrong struct";
    }

    member_mapping_scopes.pop_back();
}